

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

unique_ptr<perfetto::TracingSession,_std::default_delete<perfetto::TracingSession>_> __thiscall
perfetto::internal::TracingMuxerImpl::CreateTracingSession
          (TracingMuxerImpl *this,BackendType requested_backend_type)

{
  atomic<unsigned_long> *paVar1;
  __int_type_conflict4 _Var2;
  TaskRunner *pTVar3;
  TracingSessionImpl *this_00;
  undefined8 extraout_RAX;
  BackendType in_EDX;
  undefined4 in_register_00000034;
  TracingMuxerImpl *muxer;
  TracingSessionGlobalID session_id;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  muxer = (TracingMuxerImpl *)CONCAT44(in_register_00000034,requested_backend_type);
  LOCK();
  paVar1 = &muxer->next_tracing_session_id_;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((in_EDX & in_EDX - kInProcessBackend) == kUnspecifiedBackend) {
    session_id = _Var2 + 1;
    pTVar3 = (muxer->task_runner_)._M_t.
             super___uniq_ptr_impl<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::base::TaskRunner_*,_std::default_delete<perfetto::base::TaskRunner>_>
             .super__Head_base<0UL,_perfetto::base::TaskRunner_*,_false>._M_head_impl;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58 = (undefined8 *)0x0;
    uStack_50 = 0;
    local_58 = (undefined8 *)operator_new(0x18);
    *local_58 = muxer;
    *(BackendType *)(local_58 + 1) = in_EDX;
    local_58[2] = session_id;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:44410:26)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:44410:26)>
               ::_M_manager;
    (*pTVar3->_vptr_TaskRunner[2])(pTVar3,&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    this_00 = (TracingSessionImpl *)operator_new(0x20);
    TracingSessionImpl::TracingSessionImpl(this_00,muxer,session_id,in_EDX);
    (this->super_TracingMuxer)._vptr_TracingMuxer = (_func_int **)this_00;
    return (__uniq_ptr_data<perfetto::TracingSession,_std::default_delete<perfetto::TracingSession>,_true,_true>
            )(__uniq_ptr_data<perfetto::TracingSession,_std::default_delete<perfetto::TracingSession>,_true,_true>
              )this;
  }
  CreateTracingSession();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

std::unique_ptr<TracingSession> TracingMuxerImpl::CreateTracingSession(
    BackendType requested_backend_type) {
  TracingSessionGlobalID session_id = ++next_tracing_session_id_;

  // |backend_type| can only specify one backend, not an OR-ed mask.
  PERFETTO_CHECK((requested_backend_type & (requested_backend_type - 1)) == 0);

  // Capturing |this| is fine because the TracingMuxer is a leaky singleton.
  task_runner_->PostTask([this, requested_backend_type, session_id] {
    for (RegisteredBackend& backend : backends_) {
      if (requested_backend_type && backend.type &&
          backend.type != requested_backend_type) {
        continue;
      }

      TracingBackendId backend_id = backend.id;

      // Create the consumer now, even if we have to ask the embedder below, so
      // that any other tasks executing after this one can find the consumer and
      // change its pending attributes.
      backend.consumers.emplace_back(
          new ConsumerImpl(this, backend.type, backend.id, session_id));

      // The last registered backend in |backends_| is the unsupported backend
      // without a valid type.
      if (!backend.type) {
        PERFETTO_ELOG(
            "No tracing backend ready for type=%d, consumer will disconnect",
            requested_backend_type);
        InitializeConsumer(session_id);
        return;
      }

      // Check if the embedder wants to be asked for permission before
      // connecting the consumer.
      if (!policy_) {
        InitializeConsumer(session_id);
        return;
      }

      TracingPolicy::ShouldAllowConsumerSessionArgs args;
      args.backend_type = backend.type;
      args.result_callback = [this, backend_id, session_id](bool allow) {
        task_runner_->PostTask([this, backend_id, session_id, allow] {
          if (allow) {
            InitializeConsumer(session_id);
            return;
          }

          PERFETTO_ELOG(
              "Consumer session for backend type type=%d forbidden, "
              "consumer will disconnect",
              backends_[backend_id].type);

          auto* consumer = FindConsumer(session_id);
          if (!consumer)
            return;

          consumer->OnDisconnect();
        });
      };
      policy_->ShouldAllowConsumerSession(args);
      return;
    }
    PERFETTO_DFATAL("Not reached");
  });

  return std::unique_ptr<TracingSession>(
      new TracingSessionImpl(this, session_id, requested_backend_type));
}